

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O2

void __thiscall
duckdb::BuiltinFunctions::AddFunction(BuiltinFunctions *this,AggregateFunction *function)

{
  CreateAggregateFunctionInfo info;
  AggregateFunction local_2f8;
  CreateAggregateFunctionInfo local_1c8;
  
  AggregateFunction::AggregateFunction(&local_2f8,function);
  CreateAggregateFunctionInfo::CreateAggregateFunctionInfo(&local_1c8,&local_2f8);
  AggregateFunction::~AggregateFunction(&local_2f8);
  local_1c8.super_CreateFunctionInfo.super_CreateInfo.internal = true;
  Catalog::CreateFunction(this->catalog,this->transaction,&local_1c8.super_CreateFunctionInfo);
  CreateAggregateFunctionInfo::~CreateAggregateFunctionInfo(&local_1c8);
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(AggregateFunction function) {
	CreateAggregateFunctionInfo info(std::move(function));
	info.internal = true;
	catalog.CreateFunction(transaction, info);
}